

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_read_format_rar.c
# Opt level: O3

void test_read_format_rar_multivolume_seek_multiple_files(void)

{
  int iVar1;
  wchar_t wVar2;
  mode_t mVar3;
  archive_conflict *a;
  char *pcVar4;
  time_t tVar5;
  la_int64_t lVar6;
  la_ssize_t lVar7;
  long lVar8;
  undefined8 *puVar9;
  archive_entry *ae;
  char file_test_txt3 [65];
  char file_test_txt2 [65];
  char file_test_txt1 [65];
  char file_test_txt8 [65];
  char file_test_txt7 [65];
  char file_test_txt6 [65];
  char file_test_txt5 [65];
  char file_test_txt4 [65];
  char *reffiles [7];
  char buff [64];
  archive_entry *local_340;
  undefined8 local_338 [8];
  undefined1 local_2f8;
  undefined8 local_2e8 [8];
  undefined1 local_2a8;
  undefined8 local_298 [8];
  undefined1 local_258;
  undefined8 local_248 [8];
  undefined1 local_208;
  undefined8 local_1f8 [8];
  undefined1 local_1b8;
  undefined8 local_1a8 [8];
  undefined1 local_168;
  undefined8 local_158 [8];
  undefined1 local_118;
  undefined8 local_108 [8];
  undefined1 local_c8;
  char *local_b8;
  char *pcStack_b0;
  char *local_a8;
  char *pcStack_a0;
  char *local_98;
  char *pcStack_90;
  undefined8 local_88;
  undefined1 local_78 [72];
  
  local_88 = 0;
  local_98 = "test_rar_multivolume_multiple_files.part5.rar";
  pcStack_90 = "test_rar_multivolume_multiple_files.part6.rar";
  local_a8 = "test_rar_multivolume_multiple_files.part3.rar";
  pcStack_a0 = "test_rar_multivolume_multiple_files.part4.rar";
  local_b8 = "test_rar_multivolume_multiple_files.part1.rar";
  pcStack_b0 = "test_rar_multivolume_multiple_files.part2.rar";
  pcVar4 = "d. \n</P>\n<P STYLE=\"margin-bottom: 0in\"><BR>\n</P>\n</BODY>\n</HTML>";
  puVar9 = local_298;
  for (lVar8 = 8; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar9 = *(undefined8 *)pcVar4;
    pcVar4 = pcVar4 + 8;
    puVar9 = puVar9 + 1;
  }
  local_258 = 0;
  pcVar4 = "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4.0 Transitional//EN\">\n<";
  puVar9 = local_2e8;
  for (lVar8 = 8; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar9 = *(undefined8 *)pcVar4;
    pcVar4 = pcVar4 + 8;
    puVar9 = puVar9 + 1;
  }
  local_2a8 = 0;
  pcVar4 = "mplify writing such tests,\ntry to use platform-independent codin";
  puVar9 = local_338;
  for (lVar8 = 8; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar9 = *(undefined8 *)pcVar4;
    pcVar4 = pcVar4 + 8;
    puVar9 = puVar9 + 1;
  }
  local_2f8 = 0;
  pcVar4 = "\nfailures. \n</P>\n<H1 CLASS=\"western\"><A NAME=\"Life_cycle_of_a_te";
  puVar9 = local_108;
  for (lVar8 = 8; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar9 = *(undefined8 *)pcVar4;
    pcVar4 = pcVar4 + 8;
    puVar9 = puVar9 + 1;
  }
  local_c8 = 0;
  pcVar4 = "LE=\"margin-bottom: 0in\">DO use runtime tests for platform\n\tfeatu";
  puVar9 = local_158;
  for (lVar8 = 8; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar9 = *(undefined8 *)pcVar4;
    pcVar4 = pcVar4 + 8;
    puVar9 = puVar9 + 1;
  }
  local_118 = 0;
  pcVar4 = "rough test suite is essential\nboth for verifying new ports and f";
  puVar9 = local_1a8;
  for (lVar8 = 8; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar9 = *(undefined8 *)pcVar4;
    pcVar4 = pcVar4 + 8;
    puVar9 = puVar9 + 1;
  }
  local_168 = 0;
  pcVar4 = "m: 0in\">Creates a temporary directory\n\twhose name matches the na";
  puVar9 = local_1f8;
  for (lVar8 = 8; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar9 = *(undefined8 *)pcVar4;
    pcVar4 = pcVar4 + 8;
    puVar9 = puVar9 + 1;
  }
  local_1b8 = 0;
  pcVar4 = "lt\ninput file and verify the results. These use <TT CLASS=\"weste";
  puVar9 = local_248;
  for (lVar8 = 8; lVar8 != 0; lVar8 = lVar8 + -1) {
    *puVar9 = *(undefined8 *)pcVar4;
    pcVar4 = pcVar4 + 8;
    puVar9 = puVar9 + 1;
  }
  local_208 = 0;
  extract_reference_files(&local_b8);
  a = (archive_conflict *)archive_read_new();
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'צ',(uint)(a != (archive_conflict *)0x0),"(a = archive_read_new()) != NULL",
                   (void *)0x0);
  iVar1 = archive_read_support_filter_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ק',(uint)(iVar1 == 0),"0 == archive_read_support_filter_all(a)",a);
  iVar1 = archive_read_support_format_all((archive *)a);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ר',(uint)(iVar1 == 0),"0 == archive_read_support_format_all(a)",a);
  wVar2 = archive_read_open_filenames(a,&local_b8,0x2800);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ש',(uint)(wVar2 == L'\0'),
                   "0 == archive_read_open_filenames(a, reffiles, 10240)",a);
  iVar1 = archive_read_next_header((archive *)a,&local_340);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'׬',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_340);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'׭',"LibarchiveAddingTest2.html","\"LibarchiveAddingTest2.html\"",pcVar4,
             "archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_340);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'׮',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(local_340);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ׯ',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(local_340);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'װ',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar6 = archive_entry_size(local_340);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ױ',0x4e8f,"file_size",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(local_340);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ײ',0x81a4,"33188",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(local_340);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'׳',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'״',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  lVar6 = archive_seek_data((archive *)a,0,2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'׷',0x4e8f,"file_size",lVar6,"archive_seek_data(a, 0, SEEK_END)",
                      (void *)0x0);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'׸',(uint)(lVar7 == 0),"0 == archive_read_data(a, buff, sizeof(buff))",a);
  lVar6 = archive_seek_data((archive *)a,0x28,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'׹',0x4eb7,"file_size + 40",lVar6,"archive_seek_data(a, 40, SEEK_CUR)",
                      (void *)0x0);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'׺',(uint)(lVar7 == 0),"0 == archive_read_data(a, buff, sizeof(buff))",a);
  lVar6 = archive_seek_data((archive *)a,-0x40,2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'׾',(uint)(lVar6 == 0x4e4f),
                   "file_size - (int)sizeof(buff) == archive_seek_data(a, -(int)sizeof(buff), SEEK_END)"
                   ,a);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'׿',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'؀',local_78,"buff",local_298,"file_test_txt1",0x40,
                      "sizeof(file_test_txt1) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,-0x4e8f,2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'؃',(uint)(lVar6 == 0),"0 == archive_seek_data(a, -file_size, SEEK_END)",a);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'؄',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'؅',local_78,"buff",local_2e8,"file_test_txt2",0x40,
                      "sizeof(file_test_txt2) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0x2706,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'؈',(uint)(lVar6 == 0x2746),
                   "10054 == archive_seek_data(a, 10054 - (int)sizeof(buff), SEEK_CUR)",a);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'؉',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'؊',local_78,"buff",local_338,"file_test_txt3",0x40,
                      "sizeof(file_test_txt3) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,-0xc13,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'؎',(uint)(lVar6 == 0x1b73),
                   "7027 == archive_seek_data(a, 7027 - (10054 + (int)sizeof(buff)), SEEK_CUR)",a);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'؏',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ؐ',local_78,"buff",local_108,"file_test_txt4",0x40,
                      "sizeof(file_test_txt4) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,-0x1789,2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ؓ',(uint)(lVar6 == 0x3706),
                   "14086 == archive_seek_data(a, 14086 - file_size, SEEK_END)",a);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ؔ',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ؕ',local_78,"buff",local_158,"file_test_txt5",0x40,
                      "sizeof(file_test_txt5) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0,2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ؘ',0x4e8f,"file_size",lVar6,"archive_seek_data(a, 0, SEEK_END)",
                      (void *)0x0);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ؙ',(uint)(lVar7 == 0),"0 == archive_read_data(a, buff, sizeof(buff))",a);
  lVar6 = archive_seek_data((archive *)a,0x28,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ؚ',0x4eb7,"file_size + 40",lVar6,"archive_seek_data(a, 40, SEEK_CUR)",
                      (void *)0x0);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'؛',(uint)(lVar7 == 0),"0 == archive_read_data(a, buff, sizeof(buff))",a);
  iVar1 = archive_read_next_header((archive *)a,&local_340);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'؞',(uint)(iVar1 == 0),"0 == archive_read_next_header(a, &ae)",a);
  pcVar4 = archive_entry_pathname(local_340);
  assertion_equal_string
            ("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
             ,L'؟',"LibarchiveAddingTest.html","\"LibarchiveAddingTest.html\"",pcVar4,
             "archive_entry_pathname(ae)",(void *)0x0,L'\0');
  tVar5 = archive_entry_mtime(local_340);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ؠ',(wchar_t)tVar5,"(int)archive_entry_mtime(ae)",a);
  tVar5 = archive_entry_ctime(local_340);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ء',(wchar_t)tVar5,"(int)archive_entry_ctime(ae)",a);
  tVar5 = archive_entry_atime(local_340);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'آ',(wchar_t)tVar5,"(int)archive_entry_atime(ae)",a);
  lVar6 = archive_entry_size(local_340);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'أ',0x4e8f,"file_size",lVar6,"archive_entry_size(ae)",(void *)0x0);
  mVar3 = archive_entry_mode(local_340);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ؤ',0x81a4,"33188",(ulong)mVar3,"archive_entry_mode(ae)",(void *)0x0);
  wVar2 = archive_entry_is_encrypted(local_340);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'إ',(long)wVar2,"archive_entry_is_encrypted(ae)",0,"0",(void *)0x0);
  iVar1 = archive_read_has_encrypted_entries((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ئ',(long)iVar1,"archive_read_has_encrypted_entries(a)",0,"0",a);
  lVar6 = archive_seek_data((archive *)a,0,2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ة',0x4e8f,"file_size",lVar6,"archive_seek_data(a, 0, SEEK_END)",
                      (void *)0x0);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ت',(uint)(lVar7 == 0),"0 == archive_read_data(a, buff, sizeof(buff))",a);
  lVar6 = archive_seek_data((archive *)a,0x28,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ث',0x4eb7,"file_size + 40",lVar6,"archive_seek_data(a, 40, SEEK_CUR)",
                      (void *)0x0);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ج',(uint)(lVar7 == 0),"0 == archive_read_data(a, buff, sizeof(buff))",a);
  lVar6 = archive_seek_data((archive *)a,0x4e4f,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ذ',(uint)(lVar6 == 0x4e4f),
                   "file_size - (int)sizeof(buff) == archive_seek_data(a, file_size - (int)sizeof(buff), SEEK_SET)"
                   ,a);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ر',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ز',local_78,"buff",local_298,"file_test_txt1",0x40,
                      "sizeof(file_test_txt1) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0,0);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ص',(uint)(lVar6 == 0),"0 == archive_seek_data(a, 0, SEEK_SET)",a);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ض',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ط',local_78,"buff",local_2e8,"file_test_txt2",0x40,
                      "sizeof(file_test_txt2) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0x2706,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'غ',(uint)(lVar6 == 0x2746),
                   "10054 == archive_seek_data(a, 10054 - (int)sizeof(buff), SEEK_CUR)",a);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ػ',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ؼ',local_78,"buff",local_338,"file_test_txt3",0x40,
                      "sizeof(file_test_txt3) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,-0x23bd,1);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ؿ',(uint)(lVar6 == 0x3c9),
                   "969 == archive_seek_data(a, 969 - (10054 + (int)sizeof(buff)), SEEK_CUR)",a);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ـ',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ف',local_78,"buff",local_1a8,"file_test_txt6",0x40,
                      "sizeof(file_test_txt4) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,-0x2f32,2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ل',(uint)(lVar6 == 0x1f5d),
                   "8029 == archive_seek_data(a, 8029 - file_size, SEEK_END)",a);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'م',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ن',local_78,"buff",local_1f8,"file_test_txt7",0x40,
                      "sizeof(file_test_txt5) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,-0x139e,2);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ى',(uint)(lVar6 == 0x3af1),
                   "15089 == archive_seek_data(a, 15089 - file_size, SEEK_END)",a);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ي',(uint)(lVar7 == 0x40),
                   "sizeof(buff) == archive_read_data(a, buff, sizeof(buff))",a);
  assertion_equal_mem("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ً',local_78,"buff",local_248,"file_test_txt8",0x40,
                      "sizeof(file_test_txt5) - 1",(void *)0x0);
  lVar6 = archive_seek_data((archive *)a,0,2);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'َ',0x4e8f,"file_size",lVar6,"archive_seek_data(a, 0, SEEK_END)",
                      (void *)0x0);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ُ',(uint)(lVar7 == 0),"0 == archive_read_data(a, buff, sizeof(buff))",a);
  lVar6 = archive_seek_data((archive *)a,0x28,1);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ِ',0x4eb7,"file_size + 40",lVar6,"archive_seek_data(a, 40, SEEK_CUR)",
                      (void *)0x0);
  lVar7 = archive_read_data((archive *)a,local_78,0x40);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ّ',(uint)(lVar7 == 0),"0 == archive_read_data(a, buff, sizeof(buff))",a);
  iVar1 = archive_read_next_header((archive *)a,&local_340);
  assertion_assert("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                   ,L'ٔ',(uint)(iVar1 == 1),"1 == archive_read_next_header(a, &ae)",a);
  iVar1 = archive_file_count((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ٕ',2,"2",(long)iVar1,"archive_file_count(a)",(void *)0x0);
  iVar1 = archive_read_close((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ٖ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_close(a)",a);
  iVar1 = archive_read_free((archive *)a);
  assertion_equal_int("/workspace/llm4binary/github/license_all_cmakelists_1510/mmatuska[P]libarchive/libarchive/test/test_read_format_rar.c"
                      ,L'ٗ',0,"ARCHIVE_OK",(long)iVar1,"archive_read_free(a)",(void *)0x0);
  return;
}

Assistant:

DEFINE_TEST(test_read_format_rar_multivolume_seek_multiple_files)
{
  const char *reffiles[] =
  {
    "test_rar_multivolume_multiple_files.part1.rar",
    "test_rar_multivolume_multiple_files.part2.rar",
    "test_rar_multivolume_multiple_files.part3.rar",
    "test_rar_multivolume_multiple_files.part4.rar",
    "test_rar_multivolume_multiple_files.part5.rar",
    "test_rar_multivolume_multiple_files.part6.rar",
    NULL
  };
  char buff[64];
  int file_size = 20111;
  const char file_test_txt1[] = "d. \n</P>\n<P STYLE=\"margin-bottom: 0in\">"
                                "<BR>\n</P>\n</BODY>\n</HTML>";
  const char file_test_txt2[] = "<!DOCTYPE HTML PUBLIC \"-//W3C//DTD HTML 4."
                                "0 Transitional//EN\">\n<";
  const char file_test_txt3[] = "mplify writing such tests,\ntry to use plat"
                                "form-independent codin";
  const char file_test_txt4[] = "\nfailures. \n</P>\n<H1 CLASS=\"western\"><"
                                "A NAME=\"Life_cycle_of_a_te";
  const char file_test_txt5[] = "LE=\"margin-bottom: 0in\">DO use runtime te"
                                "sts for platform\n\tfeatu";
  const char file_test_txt6[] = "rough test suite is essential\nboth for ver"
                                "ifying new ports and f";
  const char file_test_txt7[] = "m: 0in\">Creates a temporary directory\n\tw"
                                "hose name matches the na";
  const char file_test_txt8[] = "lt\ninput file and verify the results. Thes"
                                "e use <TT CLASS=\"weste";
  struct archive_entry *ae;
  struct archive *a;

  extract_reference_files(reffiles);
  assert((a = archive_read_new()) != NULL);
  assertA(0 == archive_read_support_filter_all(a));
  assertA(0 == archive_read_support_format_all(a));
  assertA(0 == archive_read_open_filenames(a, reffiles, 10240));

  /* First header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("LibarchiveAddingTest2.html", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(file_size, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Attempt to read past end of file */
  assertEqualInt(file_size, archive_seek_data(a, 0, SEEK_END));
  assertA(0 == archive_read_data(a, buff, sizeof(buff)));
  assertEqualInt(file_size + 40, archive_seek_data(a, 40, SEEK_CUR));
  assertA(0 == archive_read_data(a, buff, sizeof(buff)));

  /* Seek to the end minus 64 bytes */
  assertA(file_size - (int)sizeof(buff) ==
    archive_seek_data(a, -(int)sizeof(buff), SEEK_END));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt1, sizeof(file_test_txt1) - 1);

  /* Seek back to the beginning */
  assertA(0 == archive_seek_data(a, -file_size, SEEK_END));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt2, sizeof(file_test_txt2) - 1);

  /* Seek to the middle of the combined data block */
  assertA(10054 == archive_seek_data(a, 10054 - (int)sizeof(buff), SEEK_CUR));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt3, sizeof(file_test_txt3) - 1);

  /* Seek to 32 bytes before the end of the first data sub-block */
  assertA(7027 == archive_seek_data(a, 7027 - (10054 + (int)sizeof(buff)),
                                    SEEK_CUR));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt4, sizeof(file_test_txt4) - 1);

  /* Seek to 32 bytes before the end of the second data sub-block */
  assertA(14086 == archive_seek_data(a, 14086 - file_size, SEEK_END));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt5, sizeof(file_test_txt5) - 1);

  /* Attempt to read past end of file */
  assertEqualInt(file_size, archive_seek_data(a, 0, SEEK_END));
  assertA(0 == archive_read_data(a, buff, sizeof(buff)));
  assertEqualInt(file_size + 40, archive_seek_data(a, 40, SEEK_CUR));
  assertA(0 == archive_read_data(a, buff, sizeof(buff)));

  /* Second header. */
  assertA(0 == archive_read_next_header(a, &ae));
  assertEqualString("LibarchiveAddingTest.html", archive_entry_pathname(ae));
  assertA((int)archive_entry_mtime(ae));
  assertA((int)archive_entry_ctime(ae));
  assertA((int)archive_entry_atime(ae));
  assertEqualInt(file_size, archive_entry_size(ae));
  assertEqualInt(33188, archive_entry_mode(ae));
  assertEqualInt(archive_entry_is_encrypted(ae), 0);
  assertEqualIntA(a, archive_read_has_encrypted_entries(a), 0);

  /* Attempt to read past end of file */
  assertEqualInt(file_size, archive_seek_data(a, 0, SEEK_END));
  assertA(0 == archive_read_data(a, buff, sizeof(buff)));
  assertEqualInt(file_size + 40, archive_seek_data(a, 40, SEEK_CUR));
  assertA(0 == archive_read_data(a, buff, sizeof(buff)));

  /* Seek to the end minus 64 bytes */
  assertA(file_size - (int)sizeof(buff) ==
    archive_seek_data(a, file_size - (int)sizeof(buff), SEEK_SET));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt1, sizeof(file_test_txt1) - 1);

  /* Seek back to the beginning */
  assertA(0 == archive_seek_data(a, 0, SEEK_SET));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt2, sizeof(file_test_txt2) - 1);

  /* Seek to the middle of the combined data block */
  assertA(10054 == archive_seek_data(a, 10054 - (int)sizeof(buff), SEEK_CUR));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt3, sizeof(file_test_txt3) - 1);

  /* Seek to 32 bytes before the end of the first data sub-block */
  assertA(969 == archive_seek_data(a, 969 - (10054 + (int)sizeof(buff)), SEEK_CUR));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt6, sizeof(file_test_txt4) - 1);

  /* Seek to 32 bytes before the end of the second data sub-block */
  assertA(8029 == archive_seek_data(a, 8029 - file_size, SEEK_END));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt7, sizeof(file_test_txt5) - 1);

  /* Seek to 32 bytes before the end of the third data sub-block */
  assertA(15089 == archive_seek_data(a, 15089 - file_size, SEEK_END));
  assertA(sizeof(buff) == archive_read_data(a, buff, sizeof(buff)));
  assertEqualMem(buff, file_test_txt8, sizeof(file_test_txt5) - 1);

  /* Attempt to read past end of file */
  assertEqualInt(file_size, archive_seek_data(a, 0, SEEK_END));
  assertA(0 == archive_read_data(a, buff, sizeof(buff)));
  assertEqualInt(file_size + 40, archive_seek_data(a, 40, SEEK_CUR));
  assertA(0 == archive_read_data(a, buff, sizeof(buff)));

  /* Test EOF */
  assertA(1 == archive_read_next_header(a, &ae));
  assertEqualInt(2, archive_file_count(a));
  assertEqualIntA(a, ARCHIVE_OK, archive_read_close(a));
  assertEqualInt(ARCHIVE_OK, archive_read_free(a));
}